

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointRecord2.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::PointRecord2::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,PointRecord2 *this)

{
  ostream *poVar1;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  PointRecord2 *local_18;
  PointRecord2 *this_local;
  
  local_18 = this;
  this_local = (PointRecord2 *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  PointRecord1::GetAsString_abi_cxx11_(&local_1c0,&this->super_PointRecord1);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\tVelocity(m/s): ");
  Vector::GetAsString_abi_cxx11_(&local_1f0,&this->m_Vel);
  std::operator<<(poVar1,(string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString PointRecord2::GetAsString() const
{
    KStringStream ss;

    ss << PointRecord1::GetAsString()
       << "\tVelocity(m/s): " <<  m_Vel.GetAsString();

    return ss.str();
}